

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_1::FrontFacingFragmentShader::shadeFragments
          (FrontFacingFragmentShader *this,FragmentPacket *param_1,int numPackets,
          FragmentShadingContext *context)

{
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  int local_40;
  int local_3c;
  int fragNdx;
  int packetNdx;
  Vec4 color;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *param_1_local;
  FrontFacingFragmentShader *this_local;
  
  color.m_data._8_8_ = context;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fragNdx);
  for (local_3c = 0; local_3c < numPackets; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
      if (*(int *)(color.m_data._8_8_ + 0x38) == 0) {
        tcu::Vector<float,_4>::Vector(&local_50,1.0,0.0,0.0,1.0);
        fragNdx = (int)local_50.m_data[0];
        packetNdx = (int)local_50.m_data[1];
        color.m_data[0] = local_50.m_data[2];
        color.m_data[1] = local_50.m_data[3];
      }
      else {
        tcu::Vector<float,_4>::Vector(&local_60,0.0,1.0,0.0,1.0);
        fragNdx = (int)local_60.m_data[0];
        packetNdx = (int)local_60.m_data[1];
        color.m_data[0] = local_60.m_data[2];
        color.m_data[1] = local_60.m_data[3];
      }
      rr::writeFragmentOutput<tcu::Vector<float,4>>
                ((FragmentShadingContext *)color.m_data._8_8_,local_3c,local_40,0,
                 (Vector<float,_4> *)&fragNdx);
    }
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* , const int numPackets, const rr::FragmentShadingContext& context) const
	{
		tcu::Vec4 color;
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; ++fragNdx)
			{
				if (context.visibleFace == rr::FACETYPE_FRONT)
					color = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
				else
					color = tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
				rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			}
		}
	}